

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void * consumer_fun(void *params)

{
  Bucket *this;
  vector<Object_*,_std::allocator<Object_*>_> *__x;
  int i;
  ulong uVar1;
  vector<Object_*,_std::allocator<Object_*>_> objs;
  _Vector_base<Object_*,_std::allocator<Object_*>_> local_30;
  
  do {
    this = FastQueue::dequeue(fastqueue);
    __x = Bucket::getObjs(this);
    std::vector<Object_*,_std::allocator<Object_*>_>::vector
              ((vector<Object_*,_std::allocator<Object_*>_> *)&local_30,__x);
    for (uVar1 = 0;
        uVar1 < (ulong)((long)local_30._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_30._M_impl.super__Vector_impl_data._M_start >> 3);
        uVar1 = uVar1 + 1) {
      *(long *)params = *params + 1;
    }
    Bucket::releaseBucket(this);
    std::_Vector_base<Object_*,_std::allocator<Object_*>_>::~_Vector_base(&local_30);
  } while( true );
}

Assistant:

void* consumer_fun(void* params){
    uint64_t* num = (uint64_t*)params;
    int index = 0;
    Bucket* bucket;

    while(true){
       
        bucket = fastqueue->dequeue();
        std::vector<Object*> objs = bucket->getObjs();
        //std::cout<< objs.size() << std::endl;
        for(int i = 0; i < objs.size(); ++i){
            (*num)++;
        }
        bucket->releaseBucket();    
   }
 
   
}